

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

utf8_size_t utf8_trimmed_length(utf8_char_t *data,utf8_size_t charcters)

{
  int iVar1;
  size_t sVar2;
  ulong in_RSI;
  utf8_char_t *in_RDI;
  size_t c;
  size_t split_at;
  size_t t;
  size_t l;
  ulong local_30;
  utf8_size_t local_28;
  long local_20;
  utf8_char_t *local_8;
  
  local_20 = 0;
  local_28 = 0;
  local_30 = 0;
  for (local_8 = in_RDI; *local_8 != '\0' && local_30 < in_RSI; local_8 = local_8 + sVar2) {
    sVar2 = utf8_char_length(local_8);
    iVar1 = utf8_char_whitespace(local_8);
    if (iVar1 == 0) {
      local_28 = local_20 + sVar2;
    }
    local_20 = sVar2 + local_20;
    local_30 = local_30 + 1;
  }
  return local_28;
}

Assistant:

size_t utf8_trimmed_length(const utf8_char_t* data, utf8_size_t charcters)
{
    size_t l, t = 0, split_at = 0;
    for (size_t c = 0; (*data) && c < charcters; ++c) {
        l = utf8_char_length(data);
        if (!utf8_char_whitespace(data)) {
            split_at = t + l;
        }
         t += l, data += l;
    }

    return split_at;
}